

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
PerformDefaultAction
          (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this_00;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pAVar1;
  Result pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  runtime_error *this_01;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 !=
      (OnCallSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)0x0) {
    pAVar1 = OnCallSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
             GetAction(this_00);
    pvVar2 = Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Perform
                       (pAVar1);
    return pvVar2;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>::address_ != 0) {
    pvVar3 = DefaultValue<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::Get()
    ;
    std::__cxx11::string::~string((string *)&message);
    return pvVar3;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&message);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }